

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O1

int __thiscall
iDynTree::ModelSolidShapes::copy(ModelSolidShapes *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  
  clear(this);
  std::
  vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
  ::resize(&this->linkSolidShapes,(*(long *)(dst + 8) - *(long *)dst >> 3) * -0x5555555555555555);
  lVar2 = *(long *)dst;
  if (*(long *)(dst + 8) != lVar2) {
    uVar5 = 0;
    do {
      lVar1 = uVar5 * 0x18;
      std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::resize
                ((this->linkSolidShapes).
                 super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar5,
                 *(long *)(lVar2 + 8 + lVar1) - *(long *)(lVar2 + lVar1) >> 3);
      lVar2 = *(long *)(*(long *)dst + lVar1);
      if (*(long *)(*(long *)dst + 8 + lVar1) != lVar2) {
        uVar4 = 0;
        do {
          uVar3 = (**(code **)(**(long **)(lVar2 + uVar4 * 8) + 0x10))();
          *(undefined8 *)
           (*(long *)&(this->linkSolidShapes).
                      super__Vector_base<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar5].
                      super__Vector_base<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>
                      ._M_impl + uVar4 * 8) = uVar3;
          uVar4 = uVar4 + 1;
          lVar2 = *(long *)(*(long *)dst + lVar1);
        } while (uVar4 < (ulong)(*(long *)(*(long *)dst + 8 + lVar1) - lVar2 >> 3));
      }
      uVar5 = uVar5 + 1;
      lVar2 = *(long *)dst;
    } while (uVar5 < (ulong)((*(long *)(dst + 8) - lVar2 >> 3) * -0x5555555555555555));
  }
  return (int)this;
}

Assistant:

ModelSolidShapes& ModelSolidShapes::copy(const ModelSolidShapes& other)
    {
        clear();
        this->linkSolidShapes.resize(other.linkSolidShapes.size());
        for (size_t link = 0; link < other.linkSolidShapes.size(); link++)
        {
            this->linkSolidShapes[link].resize(other.linkSolidShapes[link].size());
            for (size_t geom = 0; geom < other.linkSolidShapes[link].size(); geom++)
            {
                this->linkSolidShapes[link][geom] = other.linkSolidShapes[link][geom]->clone();
            }
        }

        return *this;
    }